

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O1

void __thiscall
basisu::vector<unsigned_char>::erase(vector<unsigned_char> *this,uchar *pFirst,uchar *pEnd)

{
  uint uVar1;
  uchar *puVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  if (pEnd < pFirst) {
    __assert_fail("pFirst <= pEnd",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                  ,0x318,"void basisu::vector<unsigned char>::erase(T *, T *) [T = unsigned char]");
  }
  puVar2 = this->m_p;
  if (puVar2 <= pFirst) {
    uVar1 = this->m_size;
    if (pFirst <= puVar2 + uVar1) {
      if ((pEnd < puVar2) || (puVar2 + uVar1 < pEnd)) {
        __assert_fail("pEnd >= begin() && pEnd <= end()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                      ,0x31a,
                      "void basisu::vector<unsigned char>::erase(T *, T *) [T = unsigned char]");
      }
      uVar3 = (long)pFirst - (long)puVar2;
      if (uVar3 >> 0x20 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                      ,799,"void basisu::vector<unsigned char>::erase(T *, T *) [T = unsigned char]"
                     );
      }
      uVar5 = (long)pEnd - (long)pFirst;
      if (uVar5 >> 0x20 == 0) {
        uVar4 = (int)uVar3 + (int)uVar5;
        if (uVar4 <= uVar1) {
          if (pEnd != pFirst) {
            memmove(puVar2 + uVar3,puVar2 + uVar3 + uVar5,(ulong)(uVar1 - uVar4));
            this->m_size = this->m_size - (int)uVar5;
          }
          return;
        }
        __assert_fail("(start + n) <= m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                      ,0x2e3,
                      "void basisu::vector<unsigned char>::erase(uint32_t, uint32_t) [T = unsigned char]"
                     );
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                    ,0x326,"void basisu::vector<unsigned char>::erase(T *, T *) [T = unsigned char]"
                   );
    }
  }
  __assert_fail("pFirst >= begin() && pFirst <= end()",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers.h"
                ,0x319,"void basisu::vector<unsigned char>::erase(T *, T *) [T = unsigned char]");
}

Assistant:

inline void erase(T *pFirst, T *pEnd)
      {
         assert(pFirst <= pEnd);
         assert(pFirst >= begin() && pFirst <= end());
         assert(pEnd >= begin() && pEnd <= end());

         int64_t ofs = pFirst - begin();
         if ((ofs < 0) || (ofs > UINT32_MAX))
         {
            assert(0);
            return;
         }

         int64_t n = pEnd - pFirst;
         if ((n < 0) || (n > UINT32_MAX))
         {
            assert(0);
            return;
         }

         erase((uint32_t)ofs, (uint32_t)n);
      }